

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls1Test::iterate
          (MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls1Test *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  TestError *this_01;
  undefined4 local_1f4;
  MessageBuilder local_1d8;
  uint local_54;
  undefined4 local_50;
  GLenum error_code;
  GLenum attachment;
  GLint samples;
  bool is_depth_renderable;
  uint uStack_40;
  bool is_color_renderable;
  GLenum internalformat;
  uint n_internalformat;
  uint n_internalformats;
  GLenum internalformats [6];
  GLint gl_max_internalformat_samples;
  Functions *gl;
  MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls1Test *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  initInternals(this);
  internalformats[5] = 0;
  _n_internalformat = 0x8d6200008051;
  internalformats[0] = 0x8c43;
  internalformats[1] = 0x8cac;
  internalformats[2] = 0x88f0;
  internalformats[3] = 0x8d82;
  internalformat = 6;
  uStack_40 = 0;
  do {
    if (5 < uStack_40) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    samples = (&n_internalformat)[uStack_40];
    attachment._3_1_ = samples != 0x8cacU && samples != 0x88f0;
    attachment._2_1_ = samples == 0x8cacU;
    (**(code **)(lVar4 + 0x880))(0x9100,samples,0x80a9,1,internalformats + 5);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,
                    "Could not retrieve maximum supported amount of samples for internal format",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                    ,0x642);
    error_code = internalformats[5];
    if (1 < (int)internalformats[5]) {
      (**(code **)(lVar4 + 0x1390))(0x9100,internalformats[5],samples,2,2,0);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glTexStorage2DMultisample() call generated an unexpected error.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                      ,0x651);
      if ((attachment._3_1_ & 1) == 0) {
        local_1f4 = 0x821a;
        if ((attachment._2_1_ & 1) != 0) {
          local_1f4 = 0x8d00;
        }
      }
      else {
        local_1f4 = 0x8ce0;
      }
      local_50 = local_1f4;
      (**(code **)(lVar4 + 0x6b8))(0x8ca9,local_1f4,this->to_id,0);
      local_54 = (**(code **)(lVar4 + 0x800))();
      if (local_54 != 0x502) {
        this_00 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1d8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_1d8,(char (*) [26])"An unexpected error code ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_54);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [94])
                                   " instead of GL_INVALID_OPERATION was generated by an invalid glFramebufferTextureLayer() call"
                           );
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1d8);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Invalid error code reported by glFramebufferTextureLayer() call.",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                   ,0x665);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(lVar4 + 0x480))(1,&this->to_id);
      (**(code **)(lVar4 + 0x6f8))(1,&this->to_id);
      (**(code **)(lVar4 + 0xb8))(0x9100,this->to_id);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"Could not re-create the texture object.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                      ,0x66d);
    }
    uStack_40 = uStack_40 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls1Test::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* For storing format specific maximum number of samples */
	glw::GLint gl_max_internalformat_samples = 0;

	/* Iterate through all internalformats to be used for the test */
	const glw::GLenum internalformats[] = {
		GL_RGB8, GL_RGB565, GL_SRGB8_ALPHA8, GL_DEPTH_COMPONENT32F, GL_DEPTH24_STENCIL8, GL_RGBA32I
	};
	const unsigned int n_internalformats = sizeof(internalformats) / sizeof(internalformats[0]);

	for (unsigned int n_internalformat = 0; n_internalformat < n_internalformats; ++n_internalformat)
	{
		glw::GLenum internalformat		= internalformats[n_internalformat];
		bool		is_color_renderable = false;
		bool		is_depth_renderable = false;

		if (internalformat == GL_DEPTH_COMPONENT32F)
		{
			is_depth_renderable = true;
		}
		else if (internalformat != GL_DEPTH24_STENCIL8)
		{
			is_color_renderable = true;
		}

		/* Determine a value to be used for samples argument in subsequent
		 * glTexStorage2DMultisample() call. */
		gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, internalformat, GL_SAMPLES, 1,
							   &gl_max_internalformat_samples);

		GLU_EXPECT_NO_ERROR(gl.getError(),
							"Could not retrieve maximum supported amount of samples for internal format");

		glw::GLint samples = gl_max_internalformat_samples;

		/* Skip formats that are not multisampled in implementation */
		if (samples <= 1)
		{
			continue;
		}

		/* Set the texture object storage up */
		gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, samples, internalformat, 2, /* width */
								   2,													  /* height */
								   GL_FALSE);											  /* fixedsamplelocations */

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2DMultisample() call generated an unexpected error.");

		/* Try to issue the invalid glFramebufferTextureLayer() call */
		glw::GLenum attachment = (is_color_renderable) ?
									 GL_COLOR_ATTACHMENT0 :
									 (is_depth_renderable) ? GL_DEPTH_ATTACHMENT : GL_DEPTH_STENCIL_ATTACHMENT;

		gl.framebufferTextureLayer(GL_DRAW_FRAMEBUFFER, attachment, to_id, 0, /* level */
								   0);										  /* layer */

		/* Make sure GL_INVALID_OPERATION error was generated */
		glw::GLenum error_code = gl.getError();

		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message << "An unexpected error code " << error_code
				<< " instead of GL_INVALID_OPERATION was generated by an invalid glFramebufferTextureLayer() call"
				<< tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid error code reported by glFramebufferTextureLayer() call.");
		}

		/* Re-create the texture object */
		gl.deleteTextures(1, &to_id);
		gl.genTextures(1, &to_id);
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not re-create the texture object.");
	} /* for (all internalformats) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}